

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileJsonObject(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken **ppNext;
  byte bVar1;
  SyToken *pSVar2;
  SyToken *pSVar3;
  sxi32 sVar4;
  char *zFormat;
  sxu32 nLine;
  int iVar5;
  SyToken *pStart;
  SyToken *pSVar6;
  SyToken *pTmpIn;
  bool bVar7;
  
  pGen->pIn = pGen->pIn + 1;
  pGen->pEnd = pGen->pEnd + -1;
  ppNext = &pGen->pIn;
  iVar5 = 0;
  do {
    pStart = pGen->pIn;
    while ((pStart < pGen->pEnd && ((pStart->nType & 0x20000) != 0))) {
      *ppNext = pStart + 1;
      pStart = pStart + 1;
    }
    sVar4 = jx9GetNextExpr(pStart,pGen->pEnd,ppNext);
    if (sVar4 != 0) {
      jx9VmEmitInstr(pGen->pVm,6,iVar5 * 2,1,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    pSVar2 = *ppNext;
    bVar7 = pStart < pSVar2;
    pSVar6 = pStart;
    if (bVar7) {
      bVar1 = *(byte *)((long)&pStart->nType + 2);
      pSVar3 = pStart;
      while (pSVar6 = pSVar3, (bVar1 & 0x10) == 0) {
        pSVar6 = pSVar3 + 1;
        bVar7 = pSVar6 < pSVar2;
        if (!bVar7) break;
        bVar1 = *(byte *)((long)&pSVar3[1].nType + 2);
        pSVar3 = pSVar6;
      }
    }
    if ((pSVar6->nType & 0x100000) == 0) {
      nLine = pSVar6->nLine;
      zFormat = "JSON Object: Missing colon string \":\"";
      sVar4 = -1;
LAB_00129d2c:
      sVar4 = jx9GenCompileError(pGen,sVar4,nLine,zFormat);
      if (sVar4 == -10) {
        return -10;
      }
      return 0;
    }
    if (bVar7) {
      if (pSVar2 <= pSVar6 + 1) {
        nLine = pSVar6->nLine;
        zFormat = "JSON Object: Missing entry value";
        sVar4 = 1;
        goto LAB_00129d2c;
      }
      pSVar3 = pGen->pEnd;
      pGen->pIn = pStart;
      pGen->pEnd = pSVar6;
      sVar4 = jx9CompileExpr(pGen,2,GenStateJSONObjectKeyNodeValidator);
      pGen->pIn = pSVar2;
      pGen->pEnd = pSVar3;
      pStart = pSVar6 + 1;
      if (sVar4 == -10) {
        return -10;
      }
    }
    else if (pStart == pSVar6) {
      jx9GenCompileError(pGen,1,pSVar6->nLine,"JSON Object: Missing entry key");
      pStart = pSVar6 + 1;
    }
    pSVar2 = pGen->pIn;
    pSVar6 = pGen->pEnd;
    pGen->pIn = pStart;
    pGen->pEnd = pSVar2;
    sVar4 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    pGen->pIn = pSVar2;
    pGen->pEnd = pSVar6;
    if (sVar4 == -10) {
      return -10;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonObject(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyToken *pKey, *pCur;
	sxi32 nPair = 0;
	sxi32 rc;

	pGen->pIn++; /* Jump the open querly braces '{'*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile the key */
		pKey = pCur;
		while( pCur < pGen->pIn ){
			if( pCur->nType & JX9_TK_COLON /*':'*/  ){
				break;
			}
			pCur++;
		}
		rc = SXERR_EMPTY;
		if( (pCur->nType & JX9_TK_COLON) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ABORT, pCur->nLine, "JSON Object: Missing colon string \":\"");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}

		if( pCur < pGen->pIn ){
			if( &pCur[1] >= pGen->pIn ){
				/* Missing value */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pCur->nLine, "JSON Object: Missing entry value");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				return SXRET_OK;
			}
			/* Compile the expression holding the key */
			rc = GenStateCompileJSONEntry(&(*pGen), pKey, pCur,
				EXPR_FLAG_RDONLY_LOAD                /* Do not create the variable if inexistant */, 
				GenStateJSONObjectKeyNodeValidator   /* Node validator callback */
				);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			pCur++; /* Jump the double colon ':'  */
		}else if( pKey == pCur ){
			/* Key is omitted, emit an error */
			jx9GenCompileError(&(*pGen),E_ERROR, pCur->nLine, "JSON Object: Missing entry key");
			pCur++; /* Jump the double colon ':'  */
		}else{
			/* Reset back the cursor and point to the entry value */
			pCur = pKey;
		}
		/* Compile indice value */
		rc = GenStateCompileJSONEntry(&(*pGen), pCur, pGen->pIn, EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP, nPair * 2, 1, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}